

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O0

void nhdp_domain_init_l2hop(nhdp_l2hop *l2hop)

{
  int iVar1;
  list_entity *plVar2;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  int i;
  nhdp_l2hop_domaindata *data;
  nhdp_domain *domain;
  nhdp_l2hop *l2hop_local;
  
  for (__tempptr._4_4_ = 0; plVar2 = _domain_list.next, __tempptr._4_4_ < 4;
      __tempptr._4_4_ = __tempptr._4_4_ + 1) {
    l2hop->_domaindata[__tempptr._4_4_].metric.in = 0xffffff;
    l2hop->_domaindata[__tempptr._4_4_].metric.out = 0xffffff;
  }
  for (; plVar2->prev != _domain_list.prev; plVar2 = plVar2->next) {
    iVar1 = *(int *)((long)&plVar2[-0x27].next + 4);
    if (((ulong)plVar2[-0x28].next[2].next & 1) != 0) {
      l2hop->_domaindata[iVar1].metric.in = *(uint32_t *)&plVar2[-0x28].next[1].prev;
      l2hop->_domaindata[iVar1].metric.out = *(uint32_t *)((long)&plVar2[-0x28].next[1].prev + 4);
    }
  }
  return;
}

Assistant:

void
nhdp_domain_init_l2hop(struct nhdp_l2hop *l2hop) {
  struct nhdp_domain *domain;
  struct nhdp_l2hop_domaindata *data;
  int i;

  /* initialize metrics */
  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    l2hop->_domaindata[i].metric.in = RFC7181_METRIC_INFINITE;
    l2hop->_domaindata[i].metric.out = RFC7181_METRIC_INFINITE;
  }

  list_for_each_element(&_domain_list, domain, _node) {
    data = nhdp_domain_get_l2hopdata(domain, l2hop);

    if (domain->metric->no_default_handling) {
      data->metric.in = domain->metric->incoming_2hop_start;
      data->metric.out = domain->metric->outgoing_2hop_start;
    }
  }
}